

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O3

void __thiscall
LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false>::allocate
          (LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false> *this)

{
  pointer *ppp_Var1;
  __atomic_flag_data_type _Var2;
  int iVar3;
  int iVar4;
  iterator __position;
  _dep *p_Var5;
  _dep *p_Var6;
  _dep *p_Var7;
  bool bVar8;
  _dep *h;
  _dep *local_28;
  
  iVar3 = this->chunkSize_;
  iVar4 = this->minTSize_;
  local_28 = (_dep *)malloc((long)(iVar4 * iVar3));
  p_Var7 = (_dep *)((long)&local_28->w + (long)((iVar3 + -1) * iVar4));
  p_Var5 = local_28;
  do {
    p_Var6 = (_dep *)((long)&p_Var5->w + (long)iVar4);
    p_Var5->w = (Workitem *)0x0;
    p_Var5->next = p_Var6;
    p_Var5 = p_Var6;
  } while (p_Var6 <= p_Var7);
  do {
    LOCK();
    _Var2 = (this->pool_mutex_).super___atomic_flag_base._M_i;
    (this->pool_mutex_).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var2 != false);
  __position._M_current =
       (this->v_).
       super__Vector_base<depspawn::internal::Workitem::_dep_*,_std::allocator<depspawn::internal::Workitem::_dep_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->v_).
      super__Vector_base<depspawn::internal::Workitem::_dep_*,_std::allocator<depspawn::internal::Workitem::_dep_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<depspawn::internal::Workitem::_dep*,std::allocator<depspawn::internal::Workitem::_dep*>>
    ::_M_realloc_insert<depspawn::internal::Workitem::_dep*const&>
              ((vector<depspawn::internal::Workitem::_dep*,std::allocator<depspawn::internal::Workitem::_dep*>>
                *)this,__position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    ppp_Var1 = &(this->v_).
                super__Vector_base<depspawn::internal::Workitem::_dep_*,_std::allocator<depspawn::internal::Workitem::_dep_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *ppp_Var1 = *ppp_Var1 + 1;
  }
  p_Var5 = (this->head_)._M_b._M_p;
  do {
    p_Var7->next = p_Var5;
    LOCK();
    p_Var6 = (this->head_)._M_b._M_p;
    bVar8 = p_Var5 == p_Var6;
    if (bVar8) {
      (this->head_)._M_b._M_p =
           (__pointer_type)
           (((ulong)p_Var5 & 0xffff000000000000) + 0x1000000000000 | (ulong)local_28);
      p_Var6 = p_Var5;
    }
    UNLOCK();
    p_Var5 = p_Var6;
  } while (!bVar8);
  (this->pool_mutex_).super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

void allocate() {
    char * baseptr = PoolAllocator_malloc_free<SCALABLE>::malloc(chunkSize_ * minTSize_);
    char * const endptr = baseptr +  minTSize_ * (chunkSize_ - 1);
    T * const h = reinterpret_cast<T *>(baseptr);
    T * const q = reinterpret_cast<T *>(endptr);
    T * p = h;
    do {
      baseptr += minTSize_;
      if (ALLOC_ONCE) {
        new (p) T();
      }
      p->next = reinterpret_cast<T *>(baseptr); //invalid for p=q. Will be corrected during linking
      p = static_cast<T *>(p->next);
    } while (baseptr <= endptr);
    
    while (pool_mutex_.test_and_set(std::memory_order_acquire));
    
    v_.push_back(h);

    freeLinkedList(h, q, true);
    
    pool_mutex_.clear(std::memory_order_release);
  }